

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O0

Compressed_lower_distance_matrix *
read_lower_distance_matrix
          (Compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  bool bVar1;
  long *plVar2;
  float local_34;
  undefined1 local_30 [4];
  value_t value;
  vector<float,_std::allocator<float>_> distances;
  istream *input_stream_local;
  
  distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)input_stream;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  while( true ) {
    plVar2 = (long *)std::istream::operator>>
                               (distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,&local_34);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_30,&local_34);
    std::istream::ignore();
  }
  Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
  Compressed_distance_matrix
            (__return_storage_ptr__,(vector<float,_std::allocator<float>_> *)local_30);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Compressed_lower_distance_matrix read_lower_distance_matrix(std::istream& input_stream) {
  std::vector<value_t> distances;
  value_t value;
  while (input_stream >> value) {
    distances.push_back(value);
    input_stream.ignore();
  }

  return Compressed_lower_distance_matrix(std::move(distances));
}